

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::session_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_error_alert *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  stack_allocator *psVar4;
  char *pcVar5;
  allocator<char> local_1fd;
  int local_1fc;
  int local_1f8;
  string local_1e8;
  string local_1c8;
  char local_1a8 [8];
  char buf [400];
  session_error_alert *this_local;
  
  buf._392_8_ = this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(&this->error);
  if (bVar1) {
    uVar2 = boost::system::error_code::value(&this->error);
    boost::system::error_code::message_abi_cxx11_(&local_1e8,&this->error);
    convert_from_native(&local_1c8,&local_1e8);
    uVar3 = std::__cxx11::string::c_str();
    psVar4 = std::reference_wrapper<libtorrent::aux::stack_allocator>::get(&this->m_alloc);
    local_1f8 = (this->m_msg_idx).m_idx;
    pcVar5 = libtorrent::aux::stack_allocator::ptr(psVar4,(allocation_slot)local_1f8);
    snprintf(local_1a8,400,"session error: (%d %s) %s",(ulong)uVar2,uVar3,pcVar5);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    psVar4 = std::reference_wrapper<libtorrent::aux::stack_allocator>::get(&this->m_alloc);
    local_1fc = (this->m_msg_idx).m_idx;
    pcVar5 = libtorrent::aux::stack_allocator::ptr(psVar4,(allocation_slot)local_1fc);
    snprintf(local_1a8,400,"session error: %s",pcVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_1a8,&local_1fd);
  std::allocator<char>::~allocator(&local_1fd);
  return __return_storage_ptr__;
}

Assistant:

std::string session_error_alert::message() const
	{
		char buf[400];
		if (error)
		{
			std::snprintf(buf, sizeof(buf), "session error: (%d %s) %s"
				, error.value(), convert_from_native(error.message()).c_str()
				, m_alloc.get().ptr(m_msg_idx));
		}
		else
		{
			std::snprintf(buf, sizeof(buf), "session error: %s"
				, m_alloc.get().ptr(m_msg_idx));
		}
		return buf;
	}